

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

internal_node<char,_false> *
immutable::rrb_details::internal_node_merge<char,false>
          (ref<immutable::rrb_details::internal_node<char,_false>_> *left,
          ref<immutable::rrb_details::internal_node<char,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<char,_false>_> *right)

{
  internal_node<char,_false> *piVar1;
  ulong uVar2;
  internal_node<char,_false> *piVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = 0;
  uVar4 = 0;
  if (left->ptr != (internal_node<char,_false> *)0x0) {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(left);
    uVar4 = piVar1->len - 1;
  }
  if (centre->ptr != (internal_node<char,_false> *)0x0) {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(centre);
    uVar6 = (ulong)piVar1->len;
  }
  if (right->ptr == (internal_node<char,_false> *)0x0) {
    uVar2 = 0;
  }
  else {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(right);
    uVar2 = (ulong)(piVar1->len - 1);
  }
  uVar5 = (int)uVar6 + uVar4;
  piVar1 = internal_node_create<char,false>((int)uVar2 + uVar5);
  for (lVar7 = 0; (ulong)uVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(left);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar1->child->ptr + lVar7),
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar3->child->ptr + lVar7));
  }
  for (lVar7 = 0; uVar6 << 3 != lVar7; lVar7 = lVar7 + 8) {
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(centre);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + uVar4,
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar3->child->ptr + lVar7));
    uVar4 = uVar4 + 1;
  }
  for (lVar7 = 0; uVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(right);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + uVar5,
               (ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar3->child[1].ptr + lVar7));
    uVar5 = uVar5 + 1;
  }
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_merge(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right)
      {
      // If internal node is NULL, its size is zero.
      uint32_t left_len = (left.ptr == nullptr) ? 0 : left->len - 1;
      uint32_t centre_len = (centre.ptr == nullptr) ? 0 : centre->len;
      uint32_t right_len = (right.ptr == nullptr) ? 0 : right->len - 1;

      internal_node<T, atomic_ref_counting>* merged = internal_node_create<T, atomic_ref_counting>(left_len + centre_len + right_len);
      for (uint32_t i = 0; i < left_len; ++i)
        merged->child[i] = left->child[i];
      for (uint32_t i = 0; i < centre_len; ++i)
        merged->child[left_len + i] = centre->child[i];
      for (uint32_t i = 0; i < right_len; ++i)
        merged->child[left_len + centre_len + i] = right->child[i + 1];

      return merged;
      }